

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model_removeImportedUnitsByReference_Test::TestBody(Model_removeImportedUnitsByReference_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_110 [8];
  Message local_108 [8];
  unsigned_long local_100 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c0 [8];
  Message local_b8 [15];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78 [8];
  Message local_70 [15];
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  UnitsPtr myImportedUnits;
  undefined1 local_30 [8];
  UnitsPtr myConcreteUnits;
  ModelPtr model;
  Model_removeImportedUnitsByReference_Test *this_local;
  
  commonSetupImportedUnits();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Model::units((ulong)local_30);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Model::units((ulong)&gtest_ar_.message_);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar1 = libcellml::Model::removeUnits((shared_ptr *)peVar3);
  local_61 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_60,
               "model->removeUnits(myConcreteUnits)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x362,pcVar4);
    testing::internal::AssertHelper::operator=(local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar1 = libcellml::Model::removeUnits((shared_ptr *)peVar3);
  local_a9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_a8,"model->removeUnits(myImportedUnits)",
               "false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x363,pcVar4);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_100[1] = 0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_100[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_f0,"size_t(0)","model->unitsCount()",local_100 + 1,local_100);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x365,pcVar4);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Model, removeImportedUnitsByReference)
{
    auto model = commonSetupImportedUnits();
    auto myConcreteUnits = model->units(0);
    auto myImportedUnits = model->units(1);

    EXPECT_TRUE(model->removeUnits(myConcreteUnits));
    EXPECT_TRUE(model->removeUnits(myImportedUnits));

    EXPECT_EQ(size_t(0), model->unitsCount());
}